

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

void do_ld_zpa(DisasContext_conflict1 *s,int zt,int pg,TCGv_i64 addr,int dtype,int nreg)

{
  gen_helper_gvec_mem *pgVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGMemOpIdx TVar2;
  uint32_t uVar3;
  TCGv_i32 pTVar4;
  TCGv_ptr ret;
  
  pgVar1 = do_ld_zpa::fns[s->be_data == MO_BE][dtype][nreg];
  if (pgVar1 == (gen_helper_gvec_mem *)0x0) {
    __assert_fail("fn != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-sve.c"
                  ,0x12b0,"void do_ld_zpa(DisasContext *, int, int, TCGv_i64, int, int)");
  }
  tcg_ctx = s->uc->tcg_ctx;
  uVar3 = s->sve_len;
  TVar2 = sve_memopidx(s,dtype);
  uVar3 = simd_desc_aarch64(uVar3,uVar3,zt << 8 | TVar2);
  pTVar4 = tcg_const_i32_aarch64(tcg_ctx,uVar3);
  ret = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,(long)(pg * 0x20 + 0x2c10));
  (*pgVar1)(tcg_ctx,tcg_ctx->cpu_env,ret,addr,pTVar4);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_ld_zpa(DisasContext *s, int zt, int pg,
                      TCGv_i64 addr, int dtype, int nreg)
{
    static gen_helper_gvec_mem * const fns[2][16][4] = {
        /* Little-endian */
        { { gen_helper_sve_ld1bb_r, gen_helper_sve_ld2bb_r,
            gen_helper_sve_ld3bb_r, gen_helper_sve_ld4bb_r },
          { gen_helper_sve_ld1bhu_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1bsu_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1bdu_r, NULL, NULL, NULL },

          { gen_helper_sve_ld1sds_le_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1hh_le_r, gen_helper_sve_ld2hh_le_r,
            gen_helper_sve_ld3hh_le_r, gen_helper_sve_ld4hh_le_r },
          { gen_helper_sve_ld1hsu_le_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1hdu_le_r, NULL, NULL, NULL },

          { gen_helper_sve_ld1hds_le_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1hss_le_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1ss_le_r, gen_helper_sve_ld2ss_le_r,
            gen_helper_sve_ld3ss_le_r, gen_helper_sve_ld4ss_le_r },
          { gen_helper_sve_ld1sdu_le_r, NULL, NULL, NULL },

          { gen_helper_sve_ld1bds_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1bss_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1bhs_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1dd_le_r, gen_helper_sve_ld2dd_le_r,
            gen_helper_sve_ld3dd_le_r, gen_helper_sve_ld4dd_le_r } },

        /* Big-endian */
        { { gen_helper_sve_ld1bb_r, gen_helper_sve_ld2bb_r,
            gen_helper_sve_ld3bb_r, gen_helper_sve_ld4bb_r },
          { gen_helper_sve_ld1bhu_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1bsu_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1bdu_r, NULL, NULL, NULL },

          { gen_helper_sve_ld1sds_be_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1hh_be_r, gen_helper_sve_ld2hh_be_r,
            gen_helper_sve_ld3hh_be_r, gen_helper_sve_ld4hh_be_r },
          { gen_helper_sve_ld1hsu_be_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1hdu_be_r, NULL, NULL, NULL },

          { gen_helper_sve_ld1hds_be_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1hss_be_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1ss_be_r, gen_helper_sve_ld2ss_be_r,
            gen_helper_sve_ld3ss_be_r, gen_helper_sve_ld4ss_be_r },
          { gen_helper_sve_ld1sdu_be_r, NULL, NULL, NULL },

          { gen_helper_sve_ld1bds_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1bss_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1bhs_r, NULL, NULL, NULL },
          { gen_helper_sve_ld1dd_be_r, gen_helper_sve_ld2dd_be_r,
            gen_helper_sve_ld3dd_be_r, gen_helper_sve_ld4dd_be_r } }
    };
    gen_helper_gvec_mem *fn = fns[s->be_data == MO_BE][dtype][nreg];

    /* While there are holes in the table, they are not
     * accessible via the instruction encoding.
     */
    assert(fn != NULL);
    do_mem_zpa(s, zt, pg, addr, dtype, fn);
}